

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcomplex.c
# Opt level: O0

doublecomplex z_sqrt(doublecomplex *z)

{
  double __x;
  double dVar1;
  doublecomplex dVar2;
  double dVar3;
  double imag;
  double real;
  double ci;
  double cr;
  doublecomplex *z_local;
  doublecomplex retval;
  
  __x = z->r;
  dVar1 = z->i;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar3 = sqrt(__x * __x + dVar1 * dVar1);
    retval.r = sqrt((dVar3 - __x) / 2.0);
    z_local = (doublecomplex *)(dVar1 / (retval.r * 2.0));
  }
  else {
    z_local = (doublecomplex *)sqrt(__x);
    retval.r = 0.0;
  }
  dVar2.i = retval.r;
  dVar2.r = (double)z_local;
  return dVar2;
}

Assistant:

doublecomplex z_sqrt(doublecomplex *z)
{
    doublecomplex retval;
    register double cr, ci, real, imag;

    real = z->r;
    imag = z->i;

    if ( imag == 0.0 ) {
        retval.r = sqrt(real);
        retval.i = 0.0;
    } else {
        ci = (sqrt(real*real + imag*imag) - real) / 2.0;
        ci = sqrt(ci);
        cr = imag / (2.0 * ci);
        retval.r = cr;
        retval.i = ci;
    }

    return retval;
}